

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::javanano::FileGenerator::Validate(FileGenerator *this,string *error)

{
  uint uVar1;
  Params *pPVar2;
  FileDescriptor *pFVar3;
  pointer pcVar4;
  size_t sVar5;
  undefined8 *puVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  const_iterator cVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  FileDescriptorProto file_proto;
  FileDescriptorProto local_108;
  
  FileDescriptorProto::FileDescriptorProto(&local_108);
  FileDescriptor::CopyTo(this->file_,&local_108);
  bVar8 = anon_unknown_4::UsesExtensions(&local_108.super_Message);
  if ((bVar8) && (this->params_->store_unknown_fields_ == false)) {
    std::__cxx11::string::_M_assign((string *)error);
  }
  else {
    if ((*(int *)(this->file_ + 0x78) == 0) || (this->params_->ignore_services_ != false)) {
      bVar9 = IsOuterClassNeeded(this->params_,this->file_);
      bVar8 = true;
      if (bVar9) {
        pPVar2 = this->params_;
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&(pPVar2->java_outer_classnames_)._M_t,*(key_type **)this->file_);
        if (((((_Rb_tree_header *)cVar11._M_node ==
               &(pPVar2->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header) &&
             (pFVar3 = this->file_, *(int *)(pFVar3 + 0x58) == 1)) && (*(int *)(pFVar3 + 0x68) == 0)
            ) && (*(int *)(pFVar3 + 0x88) == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"INFO: ",6);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)**(undefined8 **)this->file_,
                               (*(undefined8 **)this->file_)[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
          std::endl<char,std::char_traits<char>>(poVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Javanano generator has changed to align with java generator. An outer class will be created for this file and the single message in the file will become a nested class. Use java_multiple_files to skip generating the outer class, or set an explicit java_outer_classname to suppress this message."
                     ,0x126);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        pFVar3 = this->file_;
        pcVar4 = (this->classname_)._M_dataplus._M_p;
        uVar1 = *(uint *)(pFVar3 + 0x58);
        sVar5 = (this->classname_)._M_string_length;
        uVar13 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar13 = 0;
        }
        bVar9 = false;
        bVar8 = false;
        uVar14 = 0;
        do {
          if (uVar13 * 0xa8 + 0xa8 == uVar14 + 0xa8) break;
          puVar6 = *(undefined8 **)(*(long *)(pFVar3 + 0x60) + uVar14);
          sVar7 = puVar6[1];
          if (sVar7 == sVar5) {
            if (sVar7 == 0) {
              bVar8 = true;
              bVar9 = true;
            }
            else {
              iVar10 = bcmp((void *)*puVar6,pcVar4,sVar7);
              bVar8 = bVar9;
              if (iVar10 == 0) {
                bVar8 = true;
                bVar9 = bVar8;
              }
            }
          }
          uVar14 = uVar14 + 0xa8;
        } while (!bVar8);
        if ((this->params_->java_enum_style_ == true) && (!bVar8)) {
          pFVar3 = this->file_;
          pcVar4 = (this->classname_)._M_dataplus._M_p;
          uVar1 = *(uint *)(pFVar3 + 0x68);
          uVar13 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar13 = 0;
          }
          sVar5 = (this->classname_)._M_string_length;
          uVar14 = 0;
          do {
            if (uVar13 * 0x38 + 0x38 == uVar14 + 0x38) break;
            puVar6 = *(undefined8 **)(*(long *)(pFVar3 + 0x70) + uVar14);
            sVar7 = puVar6[1];
            if (sVar7 == sVar5) {
              if (sVar7 == 0) {
                bVar8 = true;
              }
              else {
                iVar10 = bcmp((void *)*puVar6,pcVar4,sVar7);
                if (iVar10 == 0) {
                  bVar8 = true;
                }
              }
            }
            uVar14 = uVar14 + 0x38;
          } while (!bVar8);
        }
        if (bVar8) {
          std::__cxx11::string::_M_assign((string *)error);
          std::__cxx11::string::append((char *)error);
          std::__cxx11::string::_M_append((char *)error,(ulong)(this->classname_)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)error);
        }
        bVar8 = (bool)(bVar8 ^ 1);
      }
      goto LAB_0027b7a0;
    }
    std::__cxx11::string::_M_assign((string *)error);
  }
  std::__cxx11::string::append((char *)error);
  bVar8 = false;
LAB_0027b7a0:
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  return bVar8;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check for extensions
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  if (UsesExtensions(file_proto) && !params_.store_unknown_fields()) {
    error->assign(file_->name());
    error->append(
        ": Java NANO_RUNTIME only supports extensions when the "
        "'store_unknown_fields' generator option is 'true'.");
    return false;
  }

  if (file_->service_count() != 0 && !params_.ignore_services()) {
    error->assign(file_->name());
    error->append(
      ": Java NANO_RUNTIME does not support services\"");
    return false;
  }

  if (!IsOuterClassNeeded(params_, file_)) {
    return true;
  }

  // Check whether legacy javanano generator would omit the outer class.
  if (!params_.has_java_outer_classname(file_->name())
      && file_->message_type_count() == 1
      && file_->enum_type_count() == 0 && file_->extension_count() == 0) {
    cout << "INFO: " << file_->name() << ":" << endl;
    cout << "Javanano generator has changed to align with java generator. "
        "An outer class will be created for this file and the single message "
        "in the file will become a nested class. Use java_multiple_files to "
        "skip generating the outer class, or set an explicit "
        "java_outer_classname to suppress this message." << endl;
  }

  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  bool found_conflict = false;
  for (int i = 0; !found_conflict && i < file_->message_type_count(); i++) {
    if (file_->message_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  if (params_.java_enum_style()) {
    for (int i = 0; !found_conflict && i < file_->enum_type_count(); i++) {
      if (file_->enum_type(i)->name() == classname_) {
        found_conflict = true;
      }
    }
  }
  if (found_conflict) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }
  return true;
}